

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproto.c
# Opt level: O3

int sproto_pack(void *srcv,int srcsz,void *bufferv,int bufsz)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint8_t tmp [8];
  undefined8 *local_68;
  byte *local_60;
  undefined8 local_48;
  void *local_40;
  size_t local_38;
  
  if (srcsz < 1) {
    iVar6 = 0;
  }
  else {
    uVar1 = (ulong)(uint)srcsz;
    local_40 = srcv;
    iVar6 = 0;
    iVar9 = 0;
    local_60 = (byte *)0x0;
    local_68 = (undefined8 *)0x0;
    uVar10 = 0;
    do {
      uVar11 = uVar10 + 8;
      if (uVar11 - uVar1 != 0 && (long)uVar1 <= (long)uVar11) {
        iVar3 = (int)uVar10 - srcsz;
        local_38 = (size_t)(iVar3 + 8);
        memcpy(&local_48,srcv,8 - (uVar11 - uVar1));
        memset((void *)((long)&local_48 + (7 - (ulong)(iVar3 + 7))),0,local_38);
        srcv = &local_48;
      }
      pbVar5 = (byte *)((long)bufferv + 1);
      iVar3 = bufsz + -1;
      lVar4 = 0;
      uVar7 = 0;
      bVar2 = 0;
      do {
        if (*(byte *)((long)srcv + lVar4) != 0) {
          uVar7 = uVar7 + 1;
          bVar2 = bVar2 | (byte)(1 << ((byte)lVar4 & 0x1f));
          if (0 < iVar3) {
            *pbVar5 = *(byte *)((long)srcv + lVar4);
            pbVar5 = pbVar5 + 1;
            iVar3 = iVar3 + -1;
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      pbVar5 = (byte *)bufferv;
      if (bufsz < 1) {
        pbVar5 = (byte *)0x0;
      }
      if (uVar7 == 8 || 0 < iVar9 && (uVar7 & 0xfffffffe) == 6) {
        if (iVar9 < 1) {
          bufsz = bufsz + -10;
LAB_001270ad:
          iVar9 = 1;
          iVar3 = 10;
          local_68 = (undefined8 *)srcv;
          local_60 = (byte *)bufferv;
        }
        else {
          bufsz = bufsz + -8;
LAB_0012706a:
          iVar9 = iVar9 + 1;
          iVar3 = 8;
          if (iVar9 == 0x100) {
            iVar9 = 0;
            if (-1 < bufsz) {
              local_60[0] = 0xff;
              local_60[1] = 0xff;
              memcpy(local_60 + 2,local_68,0x800);
              iVar9 = 0;
            }
          }
        }
      }
      else {
        if (pbVar5 != (byte *)0x0) {
          *pbVar5 = bVar2;
        }
        iVar3 = uVar7 + 1;
        bufsz = bufsz - iVar3;
        if (iVar3 == 10) goto LAB_001270ad;
        if (0 < iVar9 && iVar3 == 8) goto LAB_0012706a;
        if (0 < iVar9) {
          if (-1 < bufsz) {
            *local_60 = 0xff;
            local_60[1] = (char)iVar9 - 1;
            memcpy(local_60 + 2,local_68,(ulong)(uint)(iVar9 * 8));
          }
          iVar9 = 0;
        }
      }
      srcv = (void *)((long)srcv + 8);
      bufferv = (void *)((long)bufferv + (long)iVar3);
      iVar6 = iVar6 + iVar3;
      uVar10 = uVar11;
    } while (uVar11 < uVar1);
    if (-1 < bufsz) {
      if (iVar9 == 1) {
        local_60[0] = 0xff;
        local_60[1] = 0;
        *(undefined8 *)(local_60 + 2) = *local_68;
      }
      else if (1 < iVar9) {
        iVar3 = (int)local_40 - (int)local_68;
        iVar9 = iVar3 + srcsz;
        uVar7 = iVar3 + srcsz + 7;
        uVar8 = uVar7 & 0xfffffff8;
        *local_60 = 0xff;
        local_60[1] = (char)(uVar7 >> 3) - 1;
        memcpy(local_60 + 2,local_68,(long)iVar9);
        uVar7 = uVar8 - iVar9;
        if (uVar7 != 0 && iVar9 <= (int)uVar8) {
          memset(local_60 + (long)iVar9 + 2,0,(ulong)uVar7);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int
sproto_pack(const void * srcv, int srcsz, void * bufferv, int bufsz) {
	uint8_t tmp[8];
	int i;
	const uint8_t * ff_srcstart = NULL;
	uint8_t * ff_desstart = NULL;
	int ff_n = 0;
	int size = 0;
	const uint8_t * src = srcv;
	uint8_t * buffer = bufferv;
	for (i=0;i<srcsz;i+=8) {
		int n;
		int padding = i+8 - srcsz;
		if (padding > 0) {
			int j;
			memcpy(tmp, src, 8-padding);
			for (j=0;j<padding;j++) {
				tmp[7-j] = 0;
			}
			src = tmp;
		}
		n = pack_seg(src, buffer, bufsz, ff_n);
		bufsz -= n;
		if (n == 10) {
			// first FF
			ff_srcstart = src;
			ff_desstart = buffer;
			ff_n = 1;
		} else if (n==8 && ff_n>0) {
			++ff_n;
			if (ff_n == 256) {
				if (bufsz >= 0) {
					write_ff(ff_srcstart, ff_desstart, 256*8);
				}
				ff_n = 0;
			}
		} else {
			if (ff_n > 0) {
				if (bufsz >= 0) {
					write_ff(ff_srcstart, ff_desstart, ff_n*8);
				}
				ff_n = 0;
			}
		}
		src += 8;
		buffer += n;
		size += n;
	}
	if(bufsz >= 0){
		if(ff_n == 1)
			write_ff(ff_srcstart, ff_desstart, 8);
		else if (ff_n > 1)
			write_ff(ff_srcstart, ff_desstart, srcsz - (intptr_t)(ff_srcstart - (const uint8_t*)srcv));
	}
	return size;
}